

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_members.cpp
# Opt level: O1

MemberSyntax * __thiscall slang::parsing::Parser::parseClockingItem(Parser *this)

{
  SyntaxFactory *this_00;
  bool bVar1;
  int iVar2;
  SourceLocation SVar3;
  ClockingSkewSyntax *inputSkew;
  ClockingSkewSyntax *outputSkew;
  ClockingDirectionSyntax *direction;
  DefaultSkewItemSyntax *pDVar4;
  MemberSyntax *pMVar5;
  AttributeSpecSyntax *pAVar6;
  undefined4 extraout_var;
  ClockingItemSyntax *pCVar7;
  uint uVar8;
  Info *extraout_RDX;
  Info *extraout_RDX_00;
  Info *extraout_RDX_01;
  Info *extraout_RDX_02;
  Info *src;
  Info *extraout_RDX_03;
  TokenKind kind;
  Token TVar9;
  string_view sVar10;
  Token semi;
  SmallVector<slang::syntax::TokenOrSyntax,_4UL> decls;
  Token local_170;
  Token local_160;
  Token local_150;
  Token local_140;
  ClockingDirectionSyntax *local_130;
  _Variadic_union<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> local_128;
  ulong local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined1 local_f0 [16];
  SyntaxNode *local_e0;
  SyntaxNode *pSStack_d8;
  pointer local_c8;
  Token local_b8;
  undefined1 local_a8 [24];
  undefined1 auStack_90 [24];
  __extent_storage<18446744073709551615UL> local_78;
  
  Token::Token(&local_160);
  TVar9 = ParserBase::peek(&this->super_ParserBase);
  uVar8 = TVar9.kind - 0xc1;
  if ((0x26 < uVar8) || ((0x4000000003U >> ((ulong)uVar8 & 0x3f) & 1) == 0)) {
    if (TVar9.kind != DefaultKeyword) {
      pMVar5 = parseSingleMember(this,ClockingItem);
      return pMVar5;
    }
    local_160 = ParserBase::consume(&this->super_ParserBase);
  }
  Token::Token(&local_170);
  Token::Token(&local_150);
  bVar1 = ParserBase::peek(&this->super_ParserBase,InOutKeyword);
  if (bVar1) {
    local_170 = ParserBase::consume(&this->super_ParserBase);
    if (local_160.info != (Info *)0x0) {
      SVar3 = Token::location(&local_170);
      ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x620005,SVar3);
    }
    outputSkew = (ClockingSkewSyntax *)0x0;
    inputSkew = (ClockingSkewSyntax *)0x0;
  }
  else {
    bVar1 = ParserBase::peek(&this->super_ParserBase,InputKeyword);
    if (bVar1) {
      local_170 = ParserBase::consume(&this->super_ParserBase);
      inputSkew = parseClockingSkew(this);
      if ((inputSkew == (ClockingSkewSyntax *)0x0) && (local_160.info != (Info *)0x0)) {
        SVar3 = Token::location(&local_170);
        sVar10 = Token::rawText(&local_170);
        ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x330005,
                            (SourceLocation)((long)SVar3 + sVar10._M_len * 0x10000000));
        goto LAB_003c095c;
      }
    }
    else {
LAB_003c095c:
      inputSkew = (ClockingSkewSyntax *)0x0;
    }
    bVar1 = ParserBase::peek(&this->super_ParserBase,OutputKeyword);
    if (bVar1) {
      local_150 = ParserBase::consume(&this->super_ParserBase);
      outputSkew = parseClockingSkew(this);
      if ((outputSkew == (ClockingSkewSyntax *)0x0) && (local_160.info != (Info *)0x0)) {
        SVar3 = Token::location(&local_150);
        sVar10 = Token::rawText(&local_150);
        ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x330005,
                            (SourceLocation)((long)SVar3 + sVar10._M_len * 0x10000000));
        goto LAB_003c09c9;
      }
    }
    else {
LAB_003c09c9:
      outputSkew = (ClockingSkewSyntax *)0x0;
    }
    if (((local_160.info != (Info *)0x0) && (local_170.info == (Info *)0x0)) &&
       (local_150.info == (Info *)0x0)) {
      SVar3 = Token::location(&local_160);
      sVar10 = Token::valueText(&local_160);
      ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x330005,
                          (SourceLocation)((long)SVar3 + sVar10._M_len * 0x10000000));
    }
  }
  this_00 = &this->factory;
  direction = slang::syntax::SyntaxFactory::clockingDirection
                        (this_00,local_170,inputSkew,local_150,outputSkew);
  TVar9 = local_160;
  if (local_160.info != (Info *)0x0) {
    local_a8._8_4_ = SyntaxList;
    local_a8._16_8_ = (SyntaxNode *)0x0;
    auStack_90._0_8_ = (_Variadic_union<const_slang::syntax::SyntaxNode_*>)0x0;
    auStack_90._8_8_ = (Info *)0x0;
    auStack_90._16_8_ = (pointer)0x0;
    local_78._M_extent_value = 0;
    local_a8._0_8_ = &PTR_getChild_005d2768;
    local_b8 = ParserBase::expect(&this->super_ParserBase,Semicolon);
    pDVar4 = slang::syntax::SyntaxFactory::defaultSkewItem
                       (this_00,(SyntaxList<slang::syntax::AttributeInstanceSyntax> *)local_a8,TVar9
                        ,direction,local_b8);
    return &pDVar4->super_MemberSyntax;
  }
  Token::Token(&local_140);
  local_a8._0_8_ = auStack_90;
  local_a8._8_8_ = 0;
  local_a8._16_8_ = (SyntaxNode *)0x4;
  local_f0 = (undefined1  [16])ParserBase::peek(&this->super_ParserBase);
  bVar1 = slang::syntax::SyntaxFacts::isSemicolon(local_f0._0_2_);
  if (bVar1) {
    bVar1 = ParserBase::haveDiagAtCurrentLoc(&this->super_ParserBase);
    if (!bVar1) {
      SVar3 = Token::location((Token *)local_f0);
      ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x410005,SVar3);
    }
    local_140 = ParserBase::expect(&this->super_ParserBase,Semicolon);
  }
  else {
    bVar1 = slang::syntax::SyntaxFacts::isIdentifierOrComma(local_f0._0_2_);
    if (!bVar1) {
      ParserBase::reportMissingList
                (&this->super_ParserBase,(Token)local_f0,Semicolon,&local_140,(DiagCode)0x410005);
      src = extraout_RDX_03;
      goto LAB_003c0cb8;
    }
    local_130 = direction;
    do {
      pAVar6 = parseAttributeSpec(this);
      local_128._M_rest = (_Variadic_union<const_slang::syntax::SyntaxNode_*>)pAVar6;
      local_118 = CONCAT71(local_118._1_7_,1);
      SmallVectorBase<slang::syntax::TokenOrSyntax>::emplace_back<slang::syntax::TokenOrSyntax>
                ((SmallVectorBase<slang::syntax::TokenOrSyntax> *)local_a8,
                 (TokenOrSyntax *)&local_128._M_first);
      TVar9 = ParserBase::peek(&this->super_ParserBase);
      bVar1 = slang::syntax::SyntaxFacts::isSemicolon(TVar9.kind);
      iVar2 = 3;
      src = extraout_RDX;
      if (TVar9.kind == Comma && !bVar1) {
        local_128._M_first._M_storage =
             (_Uninitialized<slang::parsing::Token,_true>)
             ParserBase::expect(&this->super_ParserBase,Comma);
        local_118 = local_118 & 0xffffffffffffff00;
        SmallVectorBase<slang::syntax::TokenOrSyntax>::emplace_back<slang::syntax::TokenOrSyntax>
                  ((SmallVectorBase<slang::syntax::TokenOrSyntax> *)local_a8,
                   (TokenOrSyntax *)&local_128._M_first);
        TVar9 = ParserBase::peek(&this->super_ParserBase);
        kind = TVar9.kind;
        bVar1 = slang::syntax::SyntaxFacts::isSemicolon(kind);
        if (kind == EndOfFile || bVar1) {
          ParserBase::reportMisplacedSeparator(&this->super_ParserBase);
          src = extraout_RDX_01;
        }
        else {
          src = extraout_RDX_00;
          if (((local_f0._0_2_ != kind) || ((Info *)local_f0._8_8_ != TVar9.info)) ||
             (bVar1 = ParserBase::
                      skipBadTokens<&slang::syntax::SyntaxFacts::isIdentifierOrComma,&slang::syntax::SyntaxFacts::isSemicolon>
                                (&this->super_ParserBase,(DiagCode)0x410005,true),
             src = extraout_RDX_02, bVar1)) {
            iVar2 = 0;
            local_f0 = (undefined1  [16])TVar9;
          }
        }
      }
      direction = local_130;
    } while (iVar2 == 0);
    if (iVar2 != 3) goto LAB_003c0cb8;
    local_140 = ParserBase::expect(&this->super_ParserBase,Semicolon);
  }
  src = local_140.info;
LAB_003c0cb8:
  local_128._8_4_ = 1;
  local_118 = 0;
  uStack_110 = 0;
  local_108 = 0;
  uStack_100 = 0;
  local_f8 = 0;
  local_128._M_rest = (_Variadic_union<const_slang::syntax::SyntaxNode_*>)&PTR_getChild_005d2768;
  iVar2 = SmallVectorBase<slang::syntax::TokenOrSyntax>::copy
                    ((SmallVectorBase<slang::syntax::TokenOrSyntax> *)local_a8,
                     (EVP_PKEY_CTX *)(this->super_ParserBase).alloc,(EVP_PKEY_CTX *)src);
  local_c8 = (pointer)CONCAT44(extraout_var,iVar2);
  local_f0._8_4_ = 3;
  local_e0 = (SyntaxNode *)0x0;
  pSStack_d8 = (SyntaxNode *)0x0;
  local_f0._0_8_ = &PTR_getChild_005d5570;
  pCVar7 = slang::syntax::SyntaxFactory::clockingItem
                     (this_00,(SyntaxList<slang::syntax::AttributeInstanceSyntax> *)
                              &local_128._M_first,direction,
                      (SeparatedSyntaxList<slang::syntax::AttributeSpecSyntax> *)local_f0,local_140)
  ;
  if ((pointer)local_a8._0_8_ != (pointer)auStack_90) {
    operator_delete((void *)local_a8._0_8_);
  }
  return &pCVar7->super_MemberSyntax;
}

Assistant:

MemberSyntax* Parser::parseClockingItem() {
    Token def;
    switch (peek().kind) {
        case TokenKind::DefaultKeyword:
            def = consume();
            break;
        case TokenKind::InputKeyword:
        case TokenKind::OutputKeyword:
        case TokenKind::InOutKeyword:
            break;
        default:
            return parseSingleMember(SyntaxKind::ClockingItem);
    }

    Token input, output;
    ClockingSkewSyntax* inputSkew = nullptr;
    ClockingSkewSyntax* outputSkew = nullptr;
    if (peek(TokenKind::InOutKeyword)) {
        input = consume();
        if (def)
            addDiag(diag::InOutDefaultSkew, input.location());
    }
    else {
        if (peek(TokenKind::InputKeyword)) {
            input = consume();
            inputSkew = parseClockingSkew();
            if (def && !inputSkew)
                addDiag(diag::ExpectedClockingSkew, input.location() + input.rawText().length());
        }

        if (peek(TokenKind::OutputKeyword)) {
            output = consume();
            outputSkew = parseClockingSkew();
            if (def && !outputSkew)
                addDiag(diag::ExpectedClockingSkew, output.location() + output.rawText().length());
        }

        if (def && !input && !output)
            addDiag(diag::ExpectedClockingSkew, def.location() + def.valueText().length());
    }

    auto& direction = factory.clockingDirection(input, inputSkew, output, outputSkew);
    if (def)
        return &factory.defaultSkewItem(nullptr, def, direction, expect(TokenKind::Semicolon));

    Token semi;
    SmallVector<TokenOrSyntax, 4> decls;
    parseList<isIdentifierOrComma, isSemicolon>(decls, TokenKind::Semicolon, TokenKind::Comma, semi,
                                                RequireItems::True, diag::ExpectedIdentifier,
                                                [this] { return &parseAttributeSpec(); });

    return &factory.clockingItem(nullptr, direction, decls.copy(alloc), semi);
}